

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewParseTest.cpp
# Opt level: O0

Option * add_option(App *app,string *name,cx *variable,string *description,bool defaulted)

{
  Option *pOVar1;
  string local_2a0;
  stringstream local_280 [8];
  stringstream out;
  ostream local_270 [383];
  allocator local_f1;
  string local_f0;
  string local_d0;
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  local_b0;
  string local_80;
  Option *local_60;
  Option *opt;
  undefined1 local_50 [8];
  callback_t fun;
  bool defaulted_local;
  string *description_local;
  cx *variable_local;
  string *name_local;
  App *app_local;
  
  opt = (Option *)variable;
  fun._M_invoker._7_1_ = defaulted;
  std::function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>::
  function<add_option(CLI::App&,std::__cxx11::string,std::complex<double>&,std::__cxx11::string,bool)::__0,void>
            ((function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>
              *)local_50,(anon_class_8_1_9d70f7fa *)&opt);
  std::__cxx11::string::string((string *)&local_80,(string *)name);
  CLI::std::
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::function(&local_b0,
             (function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
              *)local_50);
  std::__cxx11::string::string((string *)&local_d0,(string *)description);
  pOVar1 = CLI::App::add_option(app,&local_80,&local_b0,&local_d0,(bool)(fun._M_invoker._7_1_ & 1));
  std::__cxx11::string::~string((string *)&local_d0);
  CLI::std::
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::~function(&local_b0);
  std::__cxx11::string::~string((string *)&local_80);
  local_60 = pOVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,"COMPLEX",&local_f1);
  CLI::Option::set_custom_option(pOVar1,&local_f0,2);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  if ((fun._M_invoker._7_1_ & 1) != 0) {
    std::__cxx11::stringstream::stringstream(local_280);
    std::operator<<(local_270,(complex *)variable);
    pOVar1 = local_60;
    std::__cxx11::stringstream::str();
    CLI::Option::set_default_str(pOVar1,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::stringstream::~stringstream(local_280);
  }
  pOVar1 = local_60;
  CLI::std::
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::~function((function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
               *)local_50);
  return pOVar1;
}

Assistant:

CLI::Option *
add_option(CLI::App &app, std::string name, cx &variable, std::string description = "", bool defaulted = false) {
    CLI::callback_t fun = [&variable](CLI::results_t res) {
        double x, y;
        bool worked = CLI::detail::lexical_cast(res[0], x) && CLI::detail::lexical_cast(res[1], y);
        if(worked)
            variable = cx(x, y);
        return worked;
    };

    CLI::Option *opt = app.add_option(name, fun, description, defaulted);
    opt->set_custom_option("COMPLEX", 2);
    if(defaulted) {
        std::stringstream out;
        out << variable;
        opt->set_default_str(out.str());
    }
    return opt;
}